

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_test.cc
# Opt level: O2

ParamGenerator<Base64TestVector> gtest_AllBase64Test_EvalGenerator_(void)

{
  testing *in_RDI;
  ParamGenerator<Base64TestVector> PVar1;
  
  PVar1 = testing::ValuesIn<Base64TestVector,42ul>(in_RDI,&kTestVectors);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<Base64TestVector>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)in_RDI;
  return (ParamGenerator<Base64TestVector>)
         PVar1.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<Base64TestVector>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

static std::string RemoveNewlines(const char *in) {
  std::string ret;
  const size_t in_len = strlen(in);

  for (size_t i = 0; i < in_len; i++) {
    if (in[i] != '\n') {
      ret.push_back(in[i]);
    }
  }

  return ret;
}